

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix_address.cpp
# Opt level: O2

ostream * sockpp::operator<<(ostream *os,unix_address *addr)

{
  ostream *poVar1;
  string local_40;
  
  poVar1 = std::operator<<(os,"unix:");
  unix_address::path_abi_cxx11_(&local_40,addr);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const unix_address& addr) {
    os << "unix:" << addr.path();
    return os;
}